

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_textlabel.cpp
# Opt level: O3

void QtMWidgets::TextLabel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QTextOption *this;
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  undefined8 uVar4;
  TextFormat TVar5;
  QColor *pQVar6;
  undefined1 local_28 [16];
  qsizetype local_18;
  
  if (_c == WriteProperty) {
    if (4 < (uint)_id) {
      return;
    }
    pQVar6 = (QColor *)*_a;
    switch(_id) {
    case 0:
      setText((TextLabel *)_o,(QString *)pQVar6);
      return;
    case 1:
      setTextFormat((TextLabel *)_o,pQVar6->cspec);
      return;
    case 2:
      setTextOption((TextLabel *)_o,(QTextOption *)pQVar6);
      return;
    case 3:
      setMargin((TextLabel *)_o,pQVar6->cspec);
      return;
    case 4:
      setColor((TextLabel *)_o,pQVar6);
      return;
    }
  }
  if (_c != ReadProperty) {
    return;
  }
  if (4 < (uint)_id) {
    return;
  }
  this = (QTextOption *)*_a;
  switch(_id) {
  case 0:
    text((QString *)local_28,(TextLabel *)_o);
    pQVar1 = *(QArrayData **)this;
    *(undefined8 *)this = local_28._0_8_;
    pcVar2 = *(char16_t **)(this + 8);
    *(undefined8 *)(this + 8) = local_28._8_8_;
    qVar3 = *(qsizetype *)(this + 0x10);
    *(qsizetype *)(this + 0x10) = local_18;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        local_28._0_8_ = pQVar1;
        local_28._8_8_ = pcVar2;
        local_18 = qVar3;
        QArrayData::deallocate(pQVar1,2,8);
      }
    }
    break;
  case 1:
    TVar5 = textFormat((TextLabel *)_o);
    goto LAB_0015450a;
  case 2:
    textOption((TextLabel *)local_28);
    QTextOption::operator=(this,(QTextOption *)local_28);
    QTextOption::~QTextOption((QTextOption *)local_28);
    break;
  case 3:
    TVar5 = margin((TextLabel *)_o);
LAB_0015450a:
    *(TextFormat *)this = TVar5;
    break;
  case 4:
    pQVar6 = color((TextLabel *)_o);
    uVar4 = *(undefined8 *)((long)&pQVar6->ct + 2);
    *(undefined8 *)this = *(undefined8 *)pQVar6;
    *(undefined8 *)(this + 6) = uVar4;
  }
  return;
}

Assistant:

void QtMWidgets::TextLabel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{

#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<TextLabel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QString*>(_v) = _t->text(); break;
        case 1: *reinterpret_cast< Qt::TextFormat*>(_v) = _t->textFormat(); break;
        case 2: *reinterpret_cast< QTextOption*>(_v) = _t->textOption(); break;
        case 3: *reinterpret_cast< int*>(_v) = _t->margin(); break;
        case 4: *reinterpret_cast< QColor*>(_v) = _t->color(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<TextLabel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setText(*reinterpret_cast< QString*>(_v)); break;
        case 1: _t->setTextFormat(*reinterpret_cast< Qt::TextFormat*>(_v)); break;
        case 2: _t->setTextOption(*reinterpret_cast< QTextOption*>(_v)); break;
        case 3: _t->setMargin(*reinterpret_cast< int*>(_v)); break;
        case 4: _t->setColor(*reinterpret_cast< QColor*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_o;
    (void)_id;
    (void)_c;
    (void)_a;
}